

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-unix-test.c++
# Opt level: O2

void __thiscall kj::anon_unknown_0::TestCase330::run(TestCase330 *this)

{
  int iVar1;
  ssize_t sVar2;
  Promise<void> promise1;
  WaitScope waitScope;
  int pipefds2 [2];
  int pipefds [2];
  Promise<void> promise2;
  Deferred<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Cosmic_Sans[P]capnproto_c___src_kj_async_unix_test_c__:346:3)>
  _kjDefer346;
  Deferred<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Cosmic_Sans[P]capnproto_c___src_kj_async_unix_test_c__:338:3)>
  _kjDefer338;
  FdObserver observer2;
  FdObserver observer;
  EventLoop loop;
  UnixEventPort port;
  
  captureSignals();
  UnixEventPort::UnixEventPort(&port);
  EventLoop::EventLoop(&loop,&port.super_EventPort);
  waitScope.busyPollInterval = 0xffffffff;
  waitScope.loop = &loop;
  EventLoop::enterScope(&loop);
  do {
    iVar1 = ::pipe(pipefds);
    if (-1 < iVar1) goto LAB_0020d7b1;
    iVar1 = _::Debug::getOsErrorNumber(false);
  } while (iVar1 == -1);
  if (iVar1 != 0) {
    _::Debug::Fault::Fault
              ((Fault *)&observer,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/async-unix-test.c++"
               ,0x151,iVar1,"pipe(pipefds)","");
    _::Debug::Fault::fatal((Fault *)&observer);
  }
LAB_0020d7b1:
  _kjDefer338.canceled = false;
  _kjDefer338.func.pipefds = &pipefds;
  UnixEventPort::FdObserver::FdObserver(&observer,&port,pipefds[0],1);
  do {
    sVar2 = ::write(pipefds[1],"foo",3);
    if (-1 < sVar2) goto LAB_0020d80a;
    iVar1 = _::Debug::getOsErrorNumber(false);
  } while (iVar1 == -1);
  if (iVar1 != 0) {
    _::Debug::Fault::Fault
              ((Fault *)&observer2,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/async-unix-test.c++"
               ,0x156,iVar1,"write(pipefds[1], \"foo\", 3)","");
    _::Debug::Fault::fatal((Fault *)&observer2);
  }
LAB_0020d80a:
  do {
    iVar1 = ::pipe(pipefds2);
    if (-1 < iVar1) goto LAB_0020d82f;
    iVar1 = _::Debug::getOsErrorNumber(false);
  } while (iVar1 == -1);
  if (iVar1 != 0) {
    _::Debug::Fault::Fault
              ((Fault *)&observer2,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/async-unix-test.c++"
               ,0x159,iVar1,"pipe(pipefds2)","");
    _::Debug::Fault::fatal((Fault *)&observer2);
  }
LAB_0020d82f:
  _kjDefer346.canceled = false;
  _kjDefer346.func.pipefds2 = &pipefds2;
  UnixEventPort::FdObserver::FdObserver(&observer2,&port,pipefds2[0],1);
  do {
    sVar2 = ::write(pipefds2[1],"bar",3);
    if (-1 < sVar2) goto LAB_0020d885;
    iVar1 = _::Debug::getOsErrorNumber(false);
  } while (iVar1 == -1);
  if (iVar1 != 0) {
    _::Debug::Fault::Fault
              ((Fault *)&promise1,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/async-unix-test.c++"
               ,0x15e,iVar1,"write(pipefds2[1], \"bar\", 3)","");
    _::Debug::Fault::fatal((Fault *)&promise1);
  }
LAB_0020d885:
  UnixEventPort::FdObserver::whenBecomesReadable((FdObserver *)&promise1);
  UnixEventPort::FdObserver::whenBecomesReadable((FdObserver *)&promise2);
  Promise<void>::wait(&promise1,&waitScope);
  Promise<void>::wait(&promise2,&waitScope);
  Own<kj::_::PromiseNode>::dispose((Own<kj::_::PromiseNode> *)&promise2);
  Own<kj::_::PromiseNode>::dispose((Own<kj::_::PromiseNode> *)&promise1);
  UnixEventPort::FdObserver::~FdObserver(&observer2);
  _::
  Deferred<(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/async-unix-test.c++:346:3)>
  ::~Deferred(&_kjDefer346);
  UnixEventPort::FdObserver::~FdObserver(&observer);
  _::
  Deferred<(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/async-unix-test.c++:338:3)>
  ::~Deferred(&_kjDefer338);
  WaitScope::~WaitScope(&waitScope);
  EventLoop::~EventLoop(&loop);
  UnixEventPort::~UnixEventPort(&port);
  return;
}

Assistant:

TEST(AsyncUnixTest, ReadObserverMultiReceive) {
  captureSignals();
  UnixEventPort port;
  EventLoop loop(port);
  WaitScope waitScope(loop);

  int pipefds[2];
  KJ_SYSCALL(pipe(pipefds));
  KJ_DEFER({ close(pipefds[1]); close(pipefds[0]); });

  UnixEventPort::FdObserver observer(port, pipefds[0],
      UnixEventPort::FdObserver::OBSERVE_READ);
  KJ_SYSCALL(write(pipefds[1], "foo", 3));

  int pipefds2[2];
  KJ_SYSCALL(pipe(pipefds2));
  KJ_DEFER({ close(pipefds2[1]); close(pipefds2[0]); });

  UnixEventPort::FdObserver observer2(port, pipefds2[0],
      UnixEventPort::FdObserver::OBSERVE_READ);
  KJ_SYSCALL(write(pipefds2[1], "bar", 3));

  auto promise1 = observer.whenBecomesReadable();
  auto promise2 = observer2.whenBecomesReadable();
  promise1.wait(waitScope);
  promise2.wait(waitScope);
}